

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O3

void LinkedList::delete_all<string_tokenizer::Token>(Node<string_tokenizer::Token> **head)

{
  pointer pcVar1;
  Node<string_tokenizer::Token> *pNVar2;
  
  pNVar2 = *head;
  if (pNVar2 == (Node<string_tokenizer::Token> *)0x0) {
    return;
  }
  if (pNVar2->_next != (Node<string_tokenizer::Token> *)0x0) {
    delete_all<string_tokenizer::Token>(&pNVar2->_next);
    pNVar2 = *head;
    if (pNVar2 == (Node<string_tokenizer::Token> *)0x0) {
      pNVar2 = (Node<string_tokenizer::Token> *)0x0;
      goto LAB_0010634c;
    }
  }
  pcVar1 = (pNVar2->_item)._token._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(pNVar2->_item)._token.field_2) {
    operator_delete(pcVar1);
  }
LAB_0010634c:
  operator_delete(pNVar2);
  *head = (Node<string_tokenizer::Token> *)0x0;
  return;
}

Assistant:

void delete_all(Node<T>*& head) {
        if (head == NULL)
            return;
        if (head->_next != NULL)
            delete_all(head->_next);
        delete head;
        head = NULL;
    }